

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_muxer_metadata.cc
# Opt level: O3

bool __thiscall SampleMuxerMetadata::AddChapter(SampleMuxerMetadata *this,cue_t *cue)

{
  _List_node_base *p_Var1;
  bool bVar2;
  Chapter *this_00;
  presentation_t pVar3;
  presentation_t pVar4;
  char *__s;
  _Self __tmp;
  _List_node_base *p_Var5;
  string title;
  char *local_48;
  undefined8 local_40;
  char local_38 [16];
  
  this_00 = mkvmuxer::Segment::AddChapter(this->segment_);
  if (this_00 == (Chapter *)0x0) {
    __s = "Unable to add chapter";
LAB_00115ef7:
    puts(__s);
    bVar2 = false;
  }
  else {
    if ((cue->identifier)._M_string_length == 0) {
      mkvmuxer::Chapter::set_id(this_00,(char *)0x0);
    }
    else {
      bVar2 = mkvmuxer::Chapter::set_id(this_00,(cue->identifier)._M_dataplus._M_p);
      if (!bVar2) {
        __s = "Unable to set chapter id";
        goto LAB_00115ef7;
      }
    }
    pVar3 = libwebvtt::Time::presentation(&cue->start_time);
    pVar4 = libwebvtt::Time::presentation(&cue->stop_time);
    mkvmuxer::Chapter::set_time(this_00,this->segment_,pVar3 * 1000000,pVar4 * 1000000);
    p_Var5 = (cue->payload).
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    local_40 = 0;
    local_38[0] = '\0';
    local_48 = local_38;
    while( true ) {
      p_Var1 = p_Var5 + 1;
      p_Var5 = p_Var5->_M_next;
      std::__cxx11::string::_M_append((char *)&local_48,(ulong)p_Var1->_M_next);
      if (p_Var5 == (_List_node_base *)&cue->payload) break;
      std::__cxx11::string::push_back((char)&local_48);
    }
    bVar2 = mkvmuxer::Chapter::add_string(this_00,local_48,(char *)0x0,(char *)0x0);
    if (!bVar2) {
      puts("Unable to set chapter title");
    }
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
  }
  return bVar2;
}

Assistant:

bool SampleMuxerMetadata::AddChapter(const cue_t& cue) {
  // TODO(matthewjheaney): support language and country

  mkvmuxer::Chapter* const chapter = segment_->AddChapter();

  if (chapter == NULL) {
    printf("Unable to add chapter\n");
    return false;
  }

  if (cue.identifier.empty()) {
    chapter->set_id(NULL);
  } else {
    const char* const id = cue.identifier.c_str();
    if (!chapter->set_id(id)) {
      printf("Unable to set chapter id\n");
      return false;
    }
  }

  typedef libwebvtt::presentation_t time_ms_t;
  const time_ms_t start_time_ms = cue.start_time.presentation();
  const time_ms_t stop_time_ms = cue.stop_time.presentation();

  enum { kNsPerMs = 1000000 };
  const uint64_t start_time_ns = start_time_ms * kNsPerMs;
  const uint64_t stop_time_ns = stop_time_ms * kNsPerMs;

  chapter->set_time(*segment_, start_time_ns, stop_time_ns);

  typedef libwebvtt::Cue::payload_t::const_iterator iter_t;
  iter_t i = cue.payload.begin();
  const iter_t j = cue.payload.end();

  std::string title;

  for (;;) {
    title += *i++;

    if (i == j)
      break;

    enum { kLF = '\x0A' };
    title += kLF;
  }

  if (!chapter->add_string(title.c_str(), NULL, NULL)) {
    printf("Unable to set chapter title\n");
    return false;
  }

  return true;
}